

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

unique_ptr<SamplePublisher,_std::default_delete<SamplePublisher>_> __thiscall
anon_unknown.dwarf_17491::createSamplePublisher(anon_unknown_dwarf_17491 *this,Value *v)

{
  Publisher *this_00;
  return_type size;
  Value *pVVar1;
  invalid_argument *this_01;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"bind",&local_39);
  pVVar1 = toml::Value::find(v,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (pVVar1 != (Value *)0x0) {
    toml::Value::as<std::__cxx11::string>(pVVar1);
    SamplePublisher::create((string *)this);
    std::__cxx11::string::string((string *)&local_38,"send_buffer",&local_39);
    pVVar1 = toml::Value::find(v,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (pVVar1 != (Value *)0x0) {
      this_00 = *(Publisher **)this;
      size = toml::Value::as<int>(pVVar1);
      Publisher::setSendBuffer(this_00,size);
    }
    return (__uniq_ptr_data<SamplePublisher,_std::default_delete<SamplePublisher>,_true,_true>)
           (__uniq_ptr_data<SamplePublisher,_std::default_delete<SamplePublisher>,_true,_true>)this;
  }
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"Expected publisher section to have \"bind\" key")
  ;
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::unique_ptr<SamplePublisher> createSamplePublisher(const toml::Value& v) {
  auto bind = v.find("bind");
  if (!bind) {
    throw std::invalid_argument(
        "Expected publisher section to have \"bind\" key");
  }

  // Only need bind value to create publisher
  auto p = SamplePublisher::create(bind->as<std::string>());

  // Optional send buffer size
  auto sendBuffer = v.find("send_buffer");
  if (sendBuffer) {
    p->setSendBuffer(sendBuffer->as<int>());
  }

  return p;
}